

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_release_value(jx9_vm *pVm,jx9_value *pValue)

{
  int iVar1;
  
  iVar1 = -0x18;
  if ((pVm != (jx9_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    iVar1 = 0;
    if (pValue != (jx9_value *)0x0) {
      jx9MemObjRelease(pValue);
      SyMemBackendPoolFree(&pVm->sAllocator,pValue);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

JX9_PRIVATE int jx9_release_value(jx9_vm *pVm, jx9_value *pValue)
{
	/* Ticket 1433-002: NULL VM is a harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return JX9_CORRUPT;
	}
	if( pValue ){
		/* Release the value */
		jx9MemObjRelease(pValue);
		SyMemBackendPoolFree(&pVm->sAllocator, pValue);
	}
	return JX9_OK;
}